

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::UnsupportedVariableIsDefined(cmGlobalGenerator *this,string *name,bool supported)

{
  const_reference this_00;
  pointer this_01;
  ostream *poVar1;
  cmake *this_02;
  bool local_209;
  cmListFileBacktrace local_208;
  string local_1f8;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream e;
  cmValue local_30;
  undefined1 local_21;
  string *psStack_20;
  bool supported_local;
  string *name_local;
  cmGlobalGenerator *this_local;
  
  local_209 = false;
  local_21 = supported;
  psStack_20 = name;
  name_local = (string *)this;
  if (!supported) {
    this_00 = std::
              vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
              ::front(&this->Makefiles);
    this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
    local_30 = cmMakefile::GetDefinition(this_01,psStack_20);
    local_209 = cmValue::operator_cast_to_bool(&local_30);
  }
  if (local_209 == false) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar1 = std::operator<<((ostream *)local_1a8,"Generator\n  ");
    (*this->_vptr_cmGlobalGenerator[3])(local_1d8);
    poVar1 = std::operator<<(poVar1,local_1d8);
    poVar1 = std::operator<<(poVar1,"\ndoes not support variable\n  ");
    poVar1 = std::operator<<(poVar1,(string *)psStack_20);
    std::operator<<(poVar1,"\nbut it has been specified.");
    std::__cxx11::string::~string(local_1d8);
    this_02 = GetCMakeInstance(this);
    std::__cxx11::ostringstream::str();
    local_208.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_208.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_208);
    cmake::IssueMessage(this_02,FATAL_ERROR,&local_1f8,&local_208);
    cmListFileBacktrace::~cmListFileBacktrace(&local_208);
    std::__cxx11::string::~string((string *)&local_1f8);
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::UnsupportedVariableIsDefined(const std::string& name,
                                                     bool supported) const
{
  if (!supported && this->Makefiles.front()->GetDefinition(name)) {
    std::ostringstream e;
    /* clang-format off */
    e <<
      "Generator\n"
      "  " << this->GetName() << "\n"
      "does not support variable\n"
      "  " << name << "\n"
      "but it has been specified."
      ;
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return true;
  }

  return false;
}